

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void sorter_merge_sort_in_place_frontmerge(int64_t *dst1,size_t l1,int64_t *dst2,size_t l2)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_t sVar5;
  int64_t _sort_swap_temp_1;
  int64_t _sort_swap_temp;
  
  plVar4 = dst2 + -l1;
  if (*dst2 < dst1[l1 - 1]) {
    do {
      while( true ) {
        plVar3 = plVar4 + 1;
        lVar1 = *dst2;
        lVar2 = *dst1;
        if (lVar1 <= lVar2) break;
        *dst1 = *plVar4;
        *plVar4 = lVar2;
        dst1 = dst1 + 1;
        l1 = l1 - 1;
        plVar4 = plVar3;
        if (l1 == 0) {
          return;
        }
      }
      *dst2 = *plVar4;
      *plVar4 = lVar1;
      dst2 = dst2 + 1;
      l2 = l2 - 1;
      plVar4 = plVar3;
    } while (l2 != 0);
    sVar5 = 0;
    do {
      lVar1 = dst1[sVar5];
      dst1[sVar5] = plVar3[sVar5];
      plVar3[sVar5] = lVar1;
      sVar5 = sVar5 + 1;
    } while (l1 != sVar5);
  }
  else {
    sVar5 = 0;
    do {
      lVar1 = dst1[sVar5];
      dst1[sVar5] = plVar4[sVar5];
      plVar4[sVar5] = lVar1;
      sVar5 = sVar5 + 1;
    } while (l1 != sVar5);
  }
  return;
}

Assistant:

void MERGE_SORT_IN_PLACE_FRONTMERGE(SORT_TYPE *dst1, size_t l1, SORT_TYPE *dst2,
                                    size_t l2) {
  SORT_TYPE *dst0 = dst2 - l1;

  if (SORT_CMP(dst1[l1 - 1], dst2[0]) <= 0) {
    MERGE_SORT_IN_PLACE_ASWAP(dst1, dst0, l1);
    return;
  }

  do {
    while (SORT_CMP(*dst2, *dst1) > 0) {
      SORT_SWAP(*dst1, *dst0);
      dst1++;
      dst0++;

      if (--l1 == 0) {
        return;
      }
    }

    SORT_SWAP(*dst2, *dst0);
    dst2++;
    dst0++;
  } while (--l2);

  do {
    SORT_SWAP(*dst1, *dst0);
    dst1++;
    dst0++;
  } while (--l1);
}